

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O2

void absl::lts_20250127::base_internal::Coalesce(AllocList *a)

{
  AllocList *head;
  AllocList *e;
  uintptr_t uVar1;
  Arena *pAVar2;
  int iVar3;
  AllocList *prev [30];
  AllocList *apAStack_118 [31];
  
  e = a->next[0];
  if (e != (AllocList *)0x0) {
    uVar1 = (a->header).size;
    if ((AllocList *)((long)a->next + (uVar1 - 0x28)) == e) {
      pAVar2 = (a->header).arena;
      (a->header).size = uVar1 + (e->header).size;
      (e->header).magic = 0;
      (e->header).arena = (Arena *)0x0;
      head = &pAVar2->freelist;
      LLA_SkiplistDelete(head,e,apAStack_118);
      LLA_SkiplistDelete(head,a,apAStack_118);
      iVar3 = LLA_SkiplistLevels((a->header).size,pAVar2->min_size,&pAVar2->random);
      a->levels = iVar3;
      LLA_SkiplistInsert(head,a,apAStack_118);
    }
  }
  return;
}

Assistant:

static void Coalesce(AllocList *a) {
  AllocList *n = a->next[0];
  if (n != nullptr && reinterpret_cast<char *>(a) + a->header.size ==
                          reinterpret_cast<char *>(n)) {
    LowLevelAlloc::Arena *arena = a->header.arena;
    a->header.size += n->header.size;
    n->header.magic = 0;
    n->header.arena = nullptr;
    AllocList *prev[kMaxLevel];
    LLA_SkiplistDelete(&arena->freelist, n, prev);
    LLA_SkiplistDelete(&arena->freelist, a, prev);
    a->levels =
        LLA_SkiplistLevels(a->header.size, arena->min_size, &arena->random);
    LLA_SkiplistInsert(&arena->freelist, a, prev);
  }
}